

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char sqlite3AffinityType(char *zIn,Column *pCol)

{
  byte bVar1;
  uint in_EAX;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  byte *zNum;
  byte bVar6;
  uint uVar7;
  undefined8 uStack_18;
  
  bVar6 = *zIn;
  uVar3 = 0;
  if (bVar6 == 0) {
    bVar5 = 0x43;
    zNum = (byte *)0x0;
  }
  else {
    pbVar2 = (byte *)(zIn + 1);
    bVar5 = 0x43;
    zNum = (byte *)0x0;
    do {
      uVar7 = uVar3 << 8;
      uVar3 = ""[bVar6] | uVar7;
      if ((int)uVar3 < 0x636c6f62) {
        if (uVar3 == 0x626c6f62) {
          if ((bVar5 != 0x45) && (bVar5 != 0x43)) goto LAB_001685d5;
          if (*pbVar2 == 0x28) {
            zNum = pbVar2;
          }
          bVar1 = 0x41;
        }
        else if (uVar3 == 0x63686172) {
          zNum = pbVar2;
          bVar1 = 0x42;
        }
        else {
LAB_001685d5:
          bVar1 = 0x45;
          if ((uVar3 != 0x646f7562 && (uVar3 != 0x666c6f61 && uVar3 != 0x7265616c) || bVar5 != 0x43)
             && (bVar1 = bVar5, ((uint)""[bVar6] | uVar7 & 0xffffff) == 0x696e74)) {
            bVar5 = 0x44;
            break;
          }
        }
      }
      else {
        if ((uVar3 != 0x636c6f62) && (uVar3 != 0x74657874)) goto LAB_001685d5;
        bVar1 = 0x42;
      }
      bVar5 = bVar1;
      bVar6 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    } while (bVar6 != 0);
  }
  if (pCol != (Column *)0x0) {
    uStack_18 = (ulong)in_EAX;
    if (bVar5 < 0x43) {
      if (zNum == (byte *)0x0) {
        uStack_18 = 0x1000000000;
      }
      else {
        bVar6 = *zNum;
        while (bVar6 != 0) {
          if (0xfffffffffffffff5 < (ulong)bVar6 - 0x3a) {
            sqlite3GetInt32((char *)zNum,(int *)((long)&uStack_18 + 4));
            break;
          }
          pbVar2 = zNum + 1;
          zNum = zNum + 1;
          bVar6 = *pbVar2;
        }
      }
    }
    iVar4 = uStack_18._4_4_ + 3;
    if (-1 < (long)uStack_18) {
      iVar4 = uStack_18._4_4_;
    }
    iVar4 = iVar4 >> 2;
    if (0xfd < iVar4) {
      iVar4 = 0xfe;
    }
    pCol->szEst = (char)iVar4 + '\x01';
  }
  return bVar5;
}

Assistant:

SQLITE_PRIVATE char sqlite3AffinityType(const char *zIn, Column *pCol){
  u32 h = 0;
  char aff = SQLITE_AFF_NUMERIC;
  const char *zChar = 0;

  assert( zIn!=0 );
  while( zIn[0] ){
    h = (h<<8) + sqlite3UpperToLower[(*zIn)&0xff];
    zIn++;
    if( h==(('c'<<24)+('h'<<16)+('a'<<8)+'r') ){             /* CHAR */
      aff = SQLITE_AFF_TEXT;
      zChar = zIn;
    }else if( h==(('c'<<24)+('l'<<16)+('o'<<8)+'b') ){       /* CLOB */
      aff = SQLITE_AFF_TEXT;
    }else if( h==(('t'<<24)+('e'<<16)+('x'<<8)+'t') ){       /* TEXT */
      aff = SQLITE_AFF_TEXT;
    }else if( h==(('b'<<24)+('l'<<16)+('o'<<8)+'b')          /* BLOB */
        && (aff==SQLITE_AFF_NUMERIC || aff==SQLITE_AFF_REAL) ){
      aff = SQLITE_AFF_BLOB;
      if( zIn[0]=='(' ) zChar = zIn;
#ifndef SQLITE_OMIT_FLOATING_POINT
    }else if( h==(('r'<<24)+('e'<<16)+('a'<<8)+'l')          /* REAL */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
    }else if( h==(('f'<<24)+('l'<<16)+('o'<<8)+'a')          /* FLOA */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
    }else if( h==(('d'<<24)+('o'<<16)+('u'<<8)+'b')          /* DOUB */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
#endif
    }else if( (h&0x00FFFFFF)==(('i'<<16)+('n'<<8)+'t') ){    /* INT */
      aff = SQLITE_AFF_INTEGER;
      break;
    }
  }

  /* If pCol is not NULL, store an estimate of the field size.  The
  ** estimate is scaled so that the size of an integer is 1.  */
  if( pCol ){
    int v = 0;   /* default size is approx 4 bytes */
    if( aff<SQLITE_AFF_NUMERIC ){
      if( zChar ){
        while( zChar[0] ){
          if( sqlite3Isdigit(zChar[0]) ){
            /* BLOB(k), VARCHAR(k), CHAR(k) -> r=(k/4+1) */
            sqlite3GetInt32(zChar, &v);
            break;
          }
          zChar++;
        }
      }else{
        v = 16;   /* BLOB, TEXT, CLOB -> r=5  (approx 20 bytes)*/
      }
    }
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( v>=sqlite3GlobalConfig.szSorterRef ){
      pCol->colFlags |= COLFLAG_SORTERREF;
    }
#endif
    v = v/4 + 1;
    if( v>255 ) v = 255;
    pCol->szEst = v;
  }
  return aff;
}